

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_set_zero(ggml_tensor *tensor)

{
  void *__s;
  long lVar1;
  long lVar2;
  size_t sVar3;
  
  if (tensor->ne[0] != 0) {
    lVar1 = 3;
    do {
      lVar2 = lVar1;
      if (lVar2 == 6) goto LAB_00122402;
      lVar1 = lVar2 + 1;
    } while (tensor->ne[lVar2 + -2] != 0);
    if (2 < lVar2 - 3U) {
LAB_00122402:
      if (tensor->buffer == (ggml_backend_buffer *)0x0) {
        __s = tensor->data;
        if (__s == (void *)0x0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x17b5,"GGML_ASSERT(%s) failed","tensor->data");
        }
        sVar3 = ggml_nbytes(tensor);
        memset(__s,0,sVar3);
      }
      else {
        sVar3 = ggml_nbytes(tensor);
        ggml_backend_tensor_memset(tensor,'\0',0,sVar3);
      }
    }
  }
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_zero(struct ggml_tensor * tensor) {
    if (ggml_is_empty(tensor)) {
        return tensor;
    }
    if (tensor->buffer) {
        ggml_backend_tensor_memset(tensor, 0, 0, ggml_nbytes(tensor));
    } else {
        GGML_ASSERT(tensor->data);
        memset(tensor->data, 0, ggml_nbytes(tensor));
    }
    return tensor;
}